

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,uint64_t val)

{
  _Bool _Var1;
  uint16_t uVar2;
  ushort uVar3;
  uint64_t uVar4;
  ulong in_RSI;
  uint16_t *in_RDI;
  uint8_t unaff_retaddr;
  container_t *in_stack_00000008;
  uint16_t low16;
  leaf_t *leaf;
  uint16_t val_low16;
  uint8_t val_high48 [6];
  undefined6 in_stack_ffffffffffffffc8;
  uint16_t in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  art_iterator_t *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = split_key(CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                    (uint8_t *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  if (((in_RDI[0x54] & 1) == 0) || (*(ulong *)(in_RDI + 0x4c) != (in_RSI & 0xffffffffffff0000))) {
    _Var1 = art_iterator_lower_bound
                      (in_stack_ffffffffffffffd8,
                       (art_key_chunk_t *)
                       CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0));
    if (!_Var1) {
      *(undefined1 *)((long)in_RDI + 0xa9) = 1;
      *(undefined1 *)(in_RDI + 0x54) = 0;
      return false;
    }
    uVar4 = combine_key((uint8_t *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffce);
    *(uint64_t *)(in_RDI + 0x4c) = uVar4;
  }
  if (*(ulong *)(in_RDI + 0x4c) == (in_RSI & 0xffffffffffff0000)) {
    uVar3 = (ushort)*(undefined8 *)(in_RDI + 0x50);
    _Var1 = container_iterator_lower_bound
                      (in_stack_00000008,unaff_retaddr,
                       (roaring_container_iterator_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                       (uint16_t)(in_RSI >> 0x30));
    if (_Var1) {
      *(ulong *)(in_RDI + 0x50) = *(ulong *)(in_RDI + 0x4c) | (ulong)uVar3;
      *(undefined1 *)(in_RDI + 0x54) = 1;
      return true;
    }
    _Var1 = art_iterator_next((art_iterator_t *)0x10fcec);
    if (!_Var1) {
      *(undefined1 *)((long)in_RDI + 0xa9) = 1;
      *(undefined1 *)(in_RDI + 0x54) = 0;
      return false;
    }
  }
  _Var1 = roaring64_iterator_init_at_leaf_first
                    ((roaring64_iterator_t *)CONCAT62(in_stack_ffffffffffffffe2,uVar2));
  return _Var1;
}

Assistant:

bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,
                                           uint64_t val) {
    uint8_t val_high48[ART_KEY_BYTES];
    uint16_t val_low16 = split_key(val, val_high48);
    if (!it->has_value || it->high48 != (val & 0xFFFFFFFFFFFF0000)) {
        // The ART iterator is before or after the high48 bits of `val` (or
        // beyond the ART altogether), so we need to move to a leaf with a key
        // equal or greater.
        if (!art_iterator_lower_bound(&it->art_it, val_high48)) {
            // Only smaller keys found.
            it->saturated_forward = true;
            return (it->has_value = false);
        }
        it->high48 = combine_key(it->art_it.key, 0);
        // Fall through to the next if statement.
    }

    if (it->high48 == (val & 0xFFFFFFFFFFFF0000)) {
        // We're at equal high bits, check if a suitable value can be found in
        // this container.
        leaf_t *leaf = (leaf_t *)it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        if (container_iterator_lower_bound(leaf->container, leaf->typecode,
                                           &it->container_it, &low16,
                                           val_low16)) {
            it->value = it->high48 | low16;
            return (it->has_value = true);
        }
        // Only smaller entries in this container, move to the next.
        if (!art_iterator_next(&it->art_it)) {
            it->saturated_forward = true;
            return (it->has_value = false);
        }
    }

    // We're at a leaf with high bits greater than `val`, so the first entry in
    // this container is our result.
    return roaring64_iterator_init_at_leaf_first(it);
}